

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O3

void test_3(string *out_dir)

{
  _func_int **pp_Var1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ChStreamOutAscii *pCVar6;
  char *__function;
  Index size;
  ChVariables *pCVar7;
  Index row;
  ChKblock CVar8;
  _func_int **pp_Var9;
  Index col;
  long lVar10;
  long lVar11;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsb;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvarsa;
  ChMatrixDynamic<> mtempA;
  ChKblockGeneric mKb;
  ChSystemDescriptor mdescriptor;
  ChVectorDynamic<double> mx;
  ChKblockGeneric mKa;
  ChMatrixDynamic<> mtempB;
  ChSolverMINRES solver;
  ChMatrix33<double> minertia;
  ChConstraintTwoBodies mca;
  ChVariablesBodyOwnMass mvarB;
  ChVariablesBodyOwnMass mvarA;
  ChVariablesBodyOwnMass mvarC;
  ChConstraintTwoBodies mcb;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_7a8;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_788;
  DenseStorage<double,__1,__1,__1,_1> local_770;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_758;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_740;
  ChKblock local_728;
  long local_720;
  long lStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_700;
  undefined8 uStack_6f8;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  long local_6d0;
  long local_6c8;
  long local_6b8;
  long local_6b0;
  ChMatrixRef local_688;
  ChKblock local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  DenseStorage<double,__1,__1,__1,_1> local_620;
  undefined1 local_608 [16];
  variable_if_dynamic<long,__1> local_5f8;
  variable_if_dynamic<long,__1> local_5f0;
  variable_if_dynamic<long,__1> local_5e8;
  variable_if_dynamic<long,__1> local_5e0;
  variable_if_dynamic<long,__1> local_5d0;
  variable_if_dynamic<long,__1> local_5c8;
  scalar_constant_op<double> local_5c0;
  variable_if_dynamic<long,__1> local_5b0;
  variable_if_dynamic<long,__1> local_5a8;
  scalar_constant_op<double> local_5a0;
  variable_if_dynamic<long,__1> local_590;
  variable_if_dynamic<long,__1> local_588;
  scalar_constant_op<double> local_580;
  variable_if_dynamic<long,__1> local_570;
  variable_if_dynamic<long,__1> local_568;
  scalar_constant_op<double> local_560;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 local_510;
  ChVectorRef local_508;
  undefined8 local_4f0;
  undefined8 local_4e8;
  double adStack_4a8 [6];
  double adStack_478 [18];
  ChVariables local_3e8 [4];
  ChVariables local_308 [4];
  ChVariables local_228 [4];
  ChConstraintTwoBodies local_148 [24];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 auStack_e8 [6];
  undefined8 auStack_b8 [18];
  
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar6,"\n-------------------------------------------------\n");
  pCVar6 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar6,"TEST: generic system with stiffness blocks \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor((ChSystemDescriptor *)&local_6f0);
  if (local_6e0 != local_6e8) {
    local_6e0 = local_6e8;
  }
  if (local_6c8 != local_6d0) {
    local_6c8 = local_6d0;
  }
  if (local_6b0 != local_6b8) {
    local_6b0 = local_6b8;
  }
  uStack_528 = 0;
  uStack_520 = 0;
  uStack_518 = 0;
  uStack_548 = 0;
  uStack_540 = 0;
  uStack_538 = 0;
  local_550 = 0x4018000000000000;
  local_530 = 0x4018000000000000;
  local_510 = 0x4018000000000000;
  chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_308);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(5.0);
  chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_308);
  chrono::ChVariables::Get_fb(&local_508,local_308);
  uVar4 = local_508.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_;
  uVar3 = local_508.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_;
  if (-1 < (long)local_508.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_) {
    if (local_508.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ != 0) {
      lVar10 = 0;
      do {
        iVar5 = rand();
        *(double *)(uVar3 + lVar10 * 8) =
             (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5 * 8.0 + -3.0;
        lVar10 = lVar10 + 1;
      } while (uVar4 != lVar10);
    }
    chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_3e8);
    chrono::ChVariablesBodyOwnMass::SetBodyMass(4.0);
    chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_3e8);
    chrono::ChVariables::Get_fb(&local_508,local_3e8);
    uVar4 = local_508.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_;
    uVar3 = local_508.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_;
    if (-1 < (long)local_508.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_) {
      if (local_508.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar5 = rand();
          dVar2 = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5;
          *(double *)(uVar3 + lVar10 * 8) = dVar2 + dVar2 + 1.0;
          lVar10 = lVar10 + 1;
        } while (uVar4 != lVar10);
      }
      chrono::ChVariablesBodyOwnMass::ChVariablesBodyOwnMass((ChVariablesBodyOwnMass *)local_228);
      chrono::ChVariablesBodyOwnMass::SetBodyMass(5.5);
      chrono::ChVariablesBodyOwnMass::SetBodyInertia((ChMatrix33 *)local_228);
      chrono::ChVariables::Get_fb(&local_508,local_228);
      if (-1 < (long)local_508.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._8_8_) {
        if (local_508.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != 0) {
          lVar10 = 0;
          do {
            iVar5 = rand();
            *(double *)
             (local_508.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + lVar10 * 8) =
                 (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5 * 11.0 + -8.0;
            lVar10 = lVar10 + 1;
          } while (local_508.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_ != lVar10);
        }
        chrono::ChSystemDescriptor::InsertVariables((ChSystemDescriptor *)&local_6f0,local_308);
        chrono::ChSystemDescriptor::InsertVariables((ChSystemDescriptor *)&local_6f0,local_3e8);
        chrono::ChSystemDescriptor::InsertVariables((ChSystemDescriptor *)&local_6f0,local_228);
        chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
                  ((ChConstraintTwoBodies *)&local_508,(ChVariablesBody *)local_308,
                   (ChVariablesBody *)local_3e8);
        lVar10 = 0xc;
        local_4f0 = 0x4008000000000000;
        do {
          iVar5 = rand();
          dVar2 = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5;
          *(double *)
           (&local_508.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             .field_0x0 + lVar10 * 8) = dVar2 + dVar2 + -1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x12);
        lVar10 = 0x12;
        do {
          iVar5 = rand();
          dVar2 = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5;
          *(double *)
           (&local_508.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             .field_0x0 + lVar10 * 8) = dVar2 + dVar2 + -1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x18);
        local_4e8 = 0x3fc999999999999a;
        chrono::ChConstraintTwoBodies::ChConstraintTwoBodies
                  (local_148,(ChVariablesBody *)local_308,(ChVariablesBody *)local_3e8);
        lVar10 = 0xc;
        local_130 = 0x4014000000000000;
        do {
          iVar5 = rand();
          dVar2 = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5;
          *(double *)(local_148 + lVar10 * 8) = dVar2 + dVar2 + -1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x12);
        lVar10 = 0x12;
        do {
          iVar5 = rand();
          dVar2 = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 + 1.0) * 0.5;
          *(double *)(local_148 + lVar10 * 8) = dVar2 + dVar2 + -1.0;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x18);
        local_128 = 0x3fb999999999999a;
        chrono::ChSystemDescriptor::InsertConstraint
                  ((ChSystemDescriptor *)&local_6f0,(ChConstraint *)&local_508);
        chrono::ChSystemDescriptor::InsertConstraint
                  ((ChSystemDescriptor *)&local_6f0,(ChConstraint *)local_148);
        local_788.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
        local_658._vptr_ChKblock = (_func_int **)__cxa_finalize;
        local_650 = 0;
        uStack_648 = 0;
        uStack_640 = 0;
        uStack_638 = 0;
        uStack_630 = 0;
        uStack_628 = 0;
        local_788.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_788.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (ChVariables **)0x0;
        local_608._0_8_ = local_308;
        std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
        _M_realloc_insert<chrono::ChVariables*>
                  ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_788,
                   (iterator)0x0,(ChVariables **)local_608);
        local_608._0_8_ = local_3e8;
        if (local_788.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_788.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
          _M_realloc_insert<chrono::ChVariables*>
                    ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_788
                     ,(iterator)
                      local_788.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(ChVariables **)local_608);
        }
        else {
          *local_788.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish = local_3e8;
          local_788.
          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_788.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
                  (&local_740,&local_788);
        chrono::ChKblockGeneric::SetVariables(&local_658,&local_740);
        if (local_740.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_740.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_740.
                                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_740.
                                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        chrono::ChKblockGeneric::Get_K((ChMatrixRef *)local_608,(ChKblockGeneric *)&local_658);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
        PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_770,
                   (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    *)local_608);
        if (-1 < (local_770.m_cols | local_770.m_rows)) {
          local_5e8.m_value = local_770.m_rows;
          local_5e0.m_value = local_770.m_cols;
          local_5d0.m_value = local_770.m_rows;
          local_5c8.m_value = local_770.m_cols;
          local_5c0.m_other = 1.0;
          local_5b0.m_value = local_770.m_rows;
          local_5a8.m_value = local_770.m_cols;
          local_5a0.m_other = 0.5;
          local_590.m_value = local_770.m_rows;
          local_588.m_value = local_770.m_cols;
          local_580.m_other = 0.6;
          local_570.m_value = local_770.m_rows;
          local_568.m_value = local_770.m_cols;
          local_560.m_other = -0.3;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_1,__1,__1> *)&local_770,
                     (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                      *)local_608,(assign_op<double,_double> *)&local_728);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage(&local_620,&local_770);
          local_688.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)&local_770;
          local_688.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = (long)&local_620;
          if (local_770.m_cols != local_620.m_rows) {
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                          "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
                         );
          }
          chrono::ChKblockGeneric::Get_K((ChMatrixRef *)local_608,(ChKblockGeneric *)&local_658);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&local_728,
                     (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
                      *)&local_688);
          if ((CONCAT44(local_608._12_4_,local_608._8_4_) == local_720) &&
             (local_5f8.m_value == lStack_718)) {
            if (0 < local_720) {
              lVar10 = 0;
              pCVar7 = (ChVariables *)local_608._0_8_;
              CVar8._vptr_ChKblock = local_728._vptr_ChKblock;
              do {
                if (0 < lStack_718) {
                  lVar11 = 0;
                  pp_Var9 = CVar8._vptr_ChKblock;
                  do {
                    pp_Var1 = (_func_int **)*pp_Var9;
                    pp_Var9 = pp_Var9 + local_720;
                    (&pCVar7->_vptr_ChVariables)[lVar11] = pp_Var1;
                    lVar11 = lVar11 + 1;
                  } while (lStack_718 != lVar11);
                }
                lVar10 = lVar10 + 1;
                CVar8._vptr_ChKblock = CVar8._vptr_ChKblock + 1;
                pCVar7 = (ChVariables *)(&pCVar7->_vptr_ChVariables + local_5f0.m_value);
              } while (lVar10 != local_720);
            }
            if (local_728._vptr_ChKblock != (_func_int **)0x0) {
              free(local_728._vptr_ChKblock[-1]);
            }
            chrono::ChSystemDescriptor::InsertKblock((ChSystemDescriptor *)&local_6f0,&local_658);
            local_728._vptr_ChKblock = (_func_int **)__cxa_finalize;
            local_7a8.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
            local_720 = 0;
            lStack_718 = 0;
            uStack_710 = 0;
            uStack_708 = 0;
            uStack_700 = 0;
            uStack_6f8 = 0;
            local_7a8.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_7a8.
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (ChVariables **)0x0;
            local_608._0_8_ = local_3e8;
            std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
            _M_realloc_insert<chrono::ChVariables*>
                      ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)
                       &local_7a8,(iterator)0x0,(ChVariables **)local_608);
            local_608._0_8_ = local_228;
            if (local_7a8.
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_7a8.
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
              _M_realloc_insert<chrono::ChVariables*>
                        ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)
                         &local_7a8,
                         (iterator)
                         local_7a8.
                         super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(ChVariables **)local_608);
            }
            else {
              *local_7a8.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = local_228;
              local_7a8.
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_7a8.
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
                      (&local_758,&local_7a8);
            chrono::ChKblockGeneric::SetVariables(&local_728,&local_758);
            if (local_758.
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_758.
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_758.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_758.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            chrono::ChKblockGeneric::Get_K((ChMatrixRef *)local_608,(ChKblockGeneric *)&local_658);
            chrono::ChKblockGeneric::Get_K(&local_688,(ChKblockGeneric *)&local_728);
            Eigen::
            MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
            ::operator=((MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         *)&local_688,
                        (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         *)local_608);
            chrono::ChSystemDescriptor::InsertKblock((ChSystemDescriptor *)&local_6f0,&local_728);
            (**(code **)(local_6f0 + 0x48))();
            chrono::ChSolverMINRES::ChSolverMINRES((ChSolverMINRES *)local_608);
            local_608._12_4_ = 100;
            local_5f8.m_value = 0x3d719799812dea11;
            local_608[8] = 1;
            local_5e8.m_value._0_1_ = 1;
            chrono::ChIterativeSolverLS::Setup((ChSystemDescriptor *)local_608);
            chrono::ChIterativeSolverLS::Solve((ChSystemDescriptor *)local_608);
            local_688.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data = (PointerType)0x0;
            local_688.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value = 0;
            chrono::ChSystemDescriptor::FromUnknownsToVector
                      ((Matrix *)&local_6f0,SUB81(&local_688,0));
            if ((XprTypeNested)
                local_688.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data != (XprTypeNested)0x0) {
              free((void *)(((XprTypeNested)
                            ((long)local_688.
                                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                   .
                                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                   .
                                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                   .m_data + -0x18))->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                           m_storage.m_cols);
            }
            chrono::ChSolverMINRES::~ChSolverMINRES((ChSolverMINRES *)local_608);
            if (local_7a8.
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_7a8.
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_7a8.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_7a8.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            chrono::ChKblockGeneric::~ChKblockGeneric((ChKblockGeneric *)&local_728);
            if (local_620.m_data != (double *)0x0) {
              free((void *)local_620.m_data[-1]);
            }
            if (local_770.m_data != (double *)0x0) {
              free((void *)local_770.m_data[-1]);
            }
            if (local_788.
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_788.
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_788.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_788.
                                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            chrono::ChKblockGeneric::~ChKblockGeneric((ChKblockGeneric *)&local_658);
            chrono::ChVariables::~ChVariables(local_228);
            chrono::ChVariables::~ChVariables(local_3e8);
            chrono::ChVariables::~ChVariables(local_308);
            chrono::ChSystemDescriptor::~ChSystemDescriptor((ChSystemDescriptor *)&local_6f0);
            return;
          }
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>]"
                       );
        }
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_001110e9;
      }
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_001110e9:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

void test_3(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with stiffness blocks \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables, constraints and stiffness, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description

    // Create C++ objects representing 'variables', set their M blocks
    // (the masses) and set their known terms 'fb'

    ChMatrix33<> minertia(6);

    ChVariablesBodyOwnMass mvarA;
    mvarA.SetBodyMass(5);
    mvarA.SetBodyInertia(minertia);
    mvarA.Get_fb().fillRandom(-3, 5);

    ChVariablesBodyOwnMass mvarB;
    mvarB.SetBodyMass(4);
    mvarB.SetBodyInertia(minertia);
    mvarB.Get_fb().fillRandom(1, 3);

    ChVariablesBodyOwnMass mvarC;
    mvarC.SetBodyMass(5.5);
    mvarC.SetBodyInertia(minertia);
    mvarC.Get_fb().fillRandom(-8, 3);

    ////ChMatrixDynamic<> foo(3, 4);
    ////foo.fillRandom(0, 10);
    ////std::cout << "foo....\n" << foo << std::endl;
    ////return;

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);
    mdescriptor.InsertVariables(&mvarC);

    // Create two C++ objects representing 'constraints' between variables
    // and set the jacobian to random values;
    // Also set cfm term (E diagonal = -cfm)

    ChConstraintTwoBodies mca(&mvarA, &mvarB);
    mca.Set_b_i(3);
    mca.Get_Cq_a().fillRandom(-1, 1);
    mca.Get_Cq_b().fillRandom(-1, 1);
    mca.Set_cfm_i(0.2);

    ChConstraintTwoBodies mcb(&mvarA, &mvarB);
    mcb.Set_b_i(5);
    mcb.Get_Cq_a().fillRandom(-1, 1);
    mcb.Get_Cq_b().fillRandom(-1, 1);
    mcb.Set_cfm_i(0.1);

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    // Create two C++ objects representing 'stiffness' between variables:

    ChKblockGeneric mKa;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsa;
    mvarsa.push_back(&mvarA);
    mvarsa.push_back(&mvarB);
    mKa.SetVariables(mvarsa);

    // just fill K with random values (but symmetric, by making a product of matr*matrtransposed)
    ChMatrixDynamic<> mtempA = mKa.Get_K();
    mtempA.fillRandom(-0.3, 0.3);
    ChMatrixDynamic<> mtempB(mtempA);
    mKa.Get_K() = -mtempA * mtempB;

    mdescriptor.InsertKblock(&mKa);

    ChKblockGeneric mKb;
    // set the affected variables (so this K is a 12x12 matrix, relative to 4 6x6 blocks)
    std::vector<ChVariables*> mvarsb;
    mvarsb.push_back(&mvarB);
    mvarsb.push_back(&mvarC);
    mKb.SetVariables(mvarsb);

    mKb.Get_K() = mKa.Get_K();

    mdescriptor.InsertKblock(&mKb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Create the solver (MINRES) ...
    ChSolverMINRES solver;
    solver.SetMaxIterations(100);
    solver.SetTolerance(1e-12);
    solver.EnableDiagonalPreconditioner(true);
    solver.SetVerbose(true);

    // .. solve the system (passing variables, constraints, stiffness
    //    blocks with the ChSystemDescriptor that we populated above)
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // .. optional: get the result as a single vector (it collects all q_i and l_i
    //    solved values stored in variables and constraints), just for check.
    chrono::ChVectorDynamic<double> mx;
    mdescriptor.FromUnknownsToVector(mx);  // x ={q,-l}

    /*
    // Alternatively, instead of using FromUnknownsToVector, to fetch
    // result, you could just loop over the variables (q values) and
    // over the constraints (l values), as already shown in previous examples:

    for (int im = 0; im < mdescriptor.GetVariablesList().size(); im++)
        GetLog() << "   " << mdescriptor.GetVariablesList()[im]->Get_qb()(0) << "\n";

    for (int ic = 0; ic < mdescriptor.GetConstraintsList().size(); ic++)
        GetLog() << "   " << mdescriptor.GetConstraintsList()[ic]->Get_l_i() << "\n";
    */
}